

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypter.cpp
# Opt level: O0

bool __thiscall
wallet::CCrypter::Encrypt
          (CCrypter *this,CKeyingMaterial *vchPlaintext,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *vchCiphertext)

{
  long lVar1;
  int iVar2;
  AES256CBCEncrypt *this_00;
  ulong uVar3;
  size_type sVar4;
  uchar *in_RDX;
  long in_RDI;
  long in_FS_OFFSET;
  size_t nLen;
  AES256CBCEncrypt enc;
  AES256CBCEncrypt *in_stack_fffffffffffffe78;
  undefined7 in_stack_fffffffffffffe80;
  undefined1 in_stack_fffffffffffffe87;
  uchar *in_stack_fffffffffffffe88;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffe98;
  bool local_10b;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*(byte *)(in_RDI + 0x30) & 1) == 0) {
    local_10b = false;
  }
  else {
    std::vector<unsigned_char,_secure_allocator<unsigned_char>_>::size
              ((vector<unsigned_char,_secure_allocator<unsigned_char>_> *)in_stack_fffffffffffffe78)
    ;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (in_stack_fffffffffffffe98,(size_type)in_RDX);
    this_00 = (AES256CBCEncrypt *)
              std::vector<unsigned_char,_secure_allocator<unsigned_char>_>::data
                        ((vector<unsigned_char,_secure_allocator<unsigned_char>_> *)
                         in_stack_fffffffffffffe78);
    std::vector<unsigned_char,_secure_allocator<unsigned_char>_>::data
              ((vector<unsigned_char,_secure_allocator<unsigned_char>_> *)in_stack_fffffffffffffe78)
    ;
    AES256CBCEncrypt::AES256CBCEncrypt
              (this_00,in_RDX,in_stack_fffffffffffffe88,(bool)in_stack_fffffffffffffe87);
    iVar2 = (int)((ulong)in_stack_fffffffffffffe88 >> 0x20);
    std::vector<unsigned_char,_secure_allocator<unsigned_char>_>::data
              ((vector<unsigned_char,_secure_allocator<unsigned_char>_> *)in_stack_fffffffffffffe78)
    ;
    std::vector<unsigned_char,_secure_allocator<unsigned_char>_>::size
              ((vector<unsigned_char,_secure_allocator<unsigned_char>_> *)in_stack_fffffffffffffe78)
    ;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffe78);
    iVar2 = AES256CBCEncrypt::Encrypt
                      (this_00,in_RDX,iVar2,
                       (uchar *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80));
    uVar3 = (ulong)iVar2;
    sVar4 = std::vector<unsigned_char,_secure_allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_secure_allocator<unsigned_char>_> *)
                       in_stack_fffffffffffffe78);
    local_10b = sVar4 <= uVar3;
    if (local_10b) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00,(size_type)in_RDX)
      ;
    }
    AES256CBCEncrypt::~AES256CBCEncrypt(in_stack_fffffffffffffe78);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_10b;
}

Assistant:

bool CCrypter::Encrypt(const CKeyingMaterial& vchPlaintext, std::vector<unsigned char> &vchCiphertext) const
{
    if (!fKeySet)
        return false;

    // max ciphertext len for a n bytes of plaintext is
    // n + AES_BLOCKSIZE bytes
    vchCiphertext.resize(vchPlaintext.size() + AES_BLOCKSIZE);

    AES256CBCEncrypt enc(vchKey.data(), vchIV.data(), true);
    size_t nLen = enc.Encrypt(vchPlaintext.data(), vchPlaintext.size(), vchCiphertext.data());
    if(nLen < vchPlaintext.size())
        return false;
    vchCiphertext.resize(nLen);

    return true;
}